

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000190a90 = 0x2d2d2d2d2d2d2d;
    uRam0000000000190a97 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00190a80 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000190a88 = 0x2d2d2d2d2d2d2d;
    DAT_00190a8f = 0x2d;
    _DAT_00190a70 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000190a78 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00190a60 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000190a68 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000190a58 = 0x2d2d2d2d2d2d2d2d;
    DAT_00190a9f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }